

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  int key;
  LogMessage *pLVar1;
  FieldDescriptor *pFVar2;
  double *pdVar3;
  uint *puVar4;
  float *pfVar5;
  bool *pbVar6;
  ArenaStringPtr *pAVar7;
  FieldDescriptor *pFVar8;
  Message *sub_message;
  int *piVar9;
  byte bVar10;
  LocalVarWrapper temp;
  MessageWrapper local_1c8;
  MessageWrapper local_1b0;
  int local_194;
  LogMessage local_190;
  Message *local_158;
  Message *local_150;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130 [16];
  FieldDescriptor *local_120;
  LogMessage *local_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar10 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar10 = 0;
  }
  local_158 = rhs;
  local_150 = lhs;
  if (bVar10 != 0) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_190,pLVar1);
    if (bVar10 != 0) {
      internal::LogMessage::~LogMessage(&local_d8);
    }
  }
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar10 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar10 = 0;
  }
  if (bVar10 != 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_190,pLVar1);
    if (bVar10 != 0) {
      internal::LogMessage::~LogMessage(&local_a0);
    }
  }
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar10 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar10 = 0;
  }
  key = *(int *)((long)&(local_150->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   3) * 0x33333334 + (this->schema_).oneof_case_offset_));
  if (bVar10 != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_190,pLVar1);
    if (bVar10 != 0) {
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  local_194 = *(int *)((long)&(local_158->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                                 *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30
                                                          )) >> 3) * 0x33333334 +
                                   (this->schema_).oneof_case_offset_));
  local_140 = local_130;
  local_138 = 0;
  local_130[0] = 0;
  if (key == 0) {
    pFVar2 = (FieldDescriptor *)0x0;
    goto LAB_003a1df2;
  }
  pFVar2 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  local_1b0.message = local_150;
  local_1b0.reflection = this;
  local_1b0.field = pFVar2;
  if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
    local_190._0_8_ = FieldDescriptor::TypeOnceInit;
    local_110._0_8_ = pFVar2;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_190,
               (FieldDescriptor **)&local_110);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar2[2] * 4)) {
  case 1:
    puVar4 = (uint *)GetRaw<int>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    goto LAB_003a1cd4;
  case 2:
    pAVar7 = (ArenaStringPtr *)GetRaw<long>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    goto LAB_003a1ddd;
  case 3:
    puVar4 = GetRaw<unsigned_int>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    goto LAB_003a1cd4;
  case 4:
    pAVar7 = (ArenaStringPtr *)
             GetRaw<unsigned_long>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    goto LAB_003a1ddd;
  case 5:
    pdVar3 = GetRaw<double>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    local_148.ptr_ = (void *)*pdVar3;
    break;
  case 6:
    pfVar5 = GetRaw<float>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    local_148.ptr_._0_4_ = *pfVar5;
    break;
  case 7:
    pbVar6 = GetRaw<bool>(local_1b0.reflection,local_1b0.message,local_1b0.field);
    local_148.ptr_._0_1_ = *pbVar6;
    break;
  case 8:
    puVar4 = (uint *)GetRaw<int>(local_1b0.reflection,local_1b0.message,local_1b0.field);
LAB_003a1cd4:
    local_148.ptr_._0_4_ = (float)*puVar4;
    break;
  case 9:
    pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                       (local_1b0.reflection,local_1b0.message,local_1b0.field);
LAB_003a1ddd:
    local_148.ptr_ = (pAVar7->tagged_ptr_).ptr_;
    break;
  case 10:
    local_148.ptr_ =
         UnsafeArenaReleaseMessage
                   (local_1b0.reflection,local_1b0.message,local_1b0.field,(MessageFactory *)0x0);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_190,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1bf);
    pLVar1 = internal::LogMessage::operator<<(&local_190,"unimplemented type: ");
    if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
      local_110._0_8_ = FieldDescriptor::TypeOnceInit;
      local_120 = pFVar2;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_110,
                 &local_120);
    }
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                       (ulong)(byte)pFVar2[2] * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar1);
    internal::LogMessage::~LogMessage(&local_190);
  }
  SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_1b0);
LAB_003a1df2:
  if (local_194 != 0) {
    pFVar8 = Descriptor::FindFieldByNumber(this->descriptor_,local_194);
    local_1b0.message = local_150;
    local_1c8.message = local_158;
    local_1c8.reflection = this;
    local_1c8.field = pFVar8;
    local_1b0.reflection = this;
    local_1b0.field = pFVar8;
    if (*(once_flag **)(pFVar8 + 0x18) != (once_flag *)0x0) {
      local_190._0_8_ = FieldDescriptor::TypeOnceInit;
      local_110._0_8_ = pFVar8;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar8 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_190,
                 (FieldDescriptor **)&local_110);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar8[2] * 4)) {
    case 1:
      piVar9 = GetRaw<int>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190.level_ = *piVar9;
      SetField<int>(local_1b0.reflection,local_1b0.message,local_1b0.field,(int *)&local_190);
      break;
    case 2:
      pdVar3 = (double *)GetRaw<long>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190._0_8_ = *pdVar3;
      SetField<long>(local_1b0.reflection,local_1b0.message,local_1b0.field,(long *)&local_190);
      break;
    case 3:
      puVar4 = GetRaw<unsigned_int>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190.level_ = *puVar4;
      SetField<unsigned_int>
                (local_1b0.reflection,local_1b0.message,local_1b0.field,&local_190.level_);
      break;
    case 4:
      pdVar3 = (double *)
               GetRaw<unsigned_long>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190._0_8_ = *pdVar3;
      SetField<unsigned_long>
                (local_1b0.reflection,local_1b0.message,local_1b0.field,(unsigned_long *)&local_190)
      ;
      break;
    case 5:
      pdVar3 = GetRaw<double>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190._0_8_ = *pdVar3;
      SetField<double>(local_1b0.reflection,local_1b0.message,local_1b0.field,(double *)&local_190);
      break;
    case 6:
      pfVar5 = GetRaw<float>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190.level_ = (LogLevel)*pfVar5;
      SetField<float>(local_1b0.reflection,local_1b0.message,local_1b0.field,(float *)&local_190);
      break;
    case 7:
      pbVar6 = GetRaw<bool>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190.level_._0_1_ = *pbVar6;
      SetField<bool>(local_1b0.reflection,local_1b0.message,local_1b0.field,(bool *)&local_190);
      break;
    case 8:
      piVar9 = GetRaw<int>(local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190.level_ = *piVar9;
      SetField<int>(local_1b0.reflection,local_1b0.message,local_1b0.field,(int *)&local_190);
      break;
    case 9:
      pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                         (local_1c8.reflection,local_1c8.message,local_1c8.field);
      local_190._0_8_ = (pAVar7->tagged_ptr_).ptr_;
      SetField<google::protobuf::internal::ArenaStringPtr>
                (local_1b0.reflection,local_1b0.message,local_1b0.field,(ArenaStringPtr *)&local_190
                );
      break;
    case 10:
      sub_message = UnsafeArenaReleaseMessage
                              (local_1c8.reflection,local_1c8.message,local_1c8.field,
                               (MessageFactory *)0x0);
      UnsafeArenaSetAllocatedMessage
                (local_1b0.reflection,local_1b0.message,sub_message,local_1b0.field);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_190,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar1 = internal::LogMessage::operator<<(&local_190,"unimplemented type: ");
      if (*(once_flag **)(pFVar8 + 0x18) != (once_flag *)0x0) {
        local_110._0_8_ = FieldDescriptor::TypeOnceInit;
        local_120 = pFVar8;
        local_118 = pLVar1;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar8 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_110,
                   &local_120);
        pLVar1 = local_118;
      }
      pLVar1 = internal::LogMessage::operator<<
                         (pLVar1,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)pFVar8[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar1);
      internal::LogMessage::~LogMessage(&local_190);
    }
    SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_1c8);
  }
  if (key != 0) {
    local_1c8.message = local_158;
    local_1c8.reflection = this;
    local_1c8.field = pFVar2;
    if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
      local_190._0_8_ = FieldDescriptor::TypeOnceInit;
      local_110._0_8_ = pFVar2;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_190,
                 (FieldDescriptor **)&local_110);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar2[2] * 4)) {
    case 1:
      local_190.level_ = (LogLevel)local_148.ptr_._0_4_;
      SetField<int>(local_1c8.reflection,local_1c8.message,local_1c8.field,(int *)&local_190);
      break;
    case 2:
      local_190._0_8_ = local_148.ptr_;
      SetField<long>(local_1c8.reflection,local_1c8.message,local_1c8.field,(long *)&local_190);
      break;
    case 3:
      local_190.level_ = (LogLevel)local_148.ptr_._0_4_;
      SetField<unsigned_int>
                (local_1c8.reflection,local_1c8.message,local_1c8.field,&local_190.level_);
      break;
    case 4:
      local_190._0_8_ = local_148.ptr_;
      SetField<unsigned_long>
                (local_1c8.reflection,local_1c8.message,local_1c8.field,(unsigned_long *)&local_190)
      ;
      break;
    case 5:
      local_190._0_8_ = local_148.ptr_;
      SetField<double>(local_1c8.reflection,local_1c8.message,local_1c8.field,(double *)&local_190);
      break;
    case 6:
      local_190.level_ = (LogLevel)local_148.ptr_._0_4_;
      SetField<float>(local_1c8.reflection,local_1c8.message,local_1c8.field,(float *)&local_190);
      break;
    case 7:
      local_190.level_._0_1_ = local_148.ptr_._0_1_;
      SetField<bool>(local_1c8.reflection,local_1c8.message,local_1c8.field,(bool *)&local_190);
      break;
    case 8:
      local_190.level_ = (LogLevel)local_148.ptr_._0_4_;
      SetField<int>(local_1c8.reflection,local_1c8.message,local_1c8.field,(int *)&local_190);
      break;
    case 9:
      local_190._0_8_ = local_148.ptr_;
      SetField<google::protobuf::internal::ArenaStringPtr>
                (local_1c8.reflection,local_1c8.message,local_1c8.field,(ArenaStringPtr *)&local_190
                );
      break;
    case 10:
      UnsafeArenaSetAllocatedMessage
                (local_1c8.reflection,local_1c8.message,(Message *)local_148.ptr_,local_1c8.field);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_190,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar1 = internal::LogMessage::operator<<(&local_190,"unimplemented type: ");
      if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
        local_110._0_8_ = FieldDescriptor::TypeOnceInit;
        local_120 = pFVar2;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_110,
                   &local_120);
      }
      pLVar1 = internal::LogMessage::operator<<
                         (pLVar1,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)pFVar2[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar1);
      internal::LogMessage::~LogMessage(&local_190);
    }
  }
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar10 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar10 = 0;
  }
  if (bVar10 != 0) {
    internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x97b);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_110,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_190,pLVar1);
    if (bVar10 != 0) {
      internal::LogMessage::~LogMessage(&local_110);
    }
  }
  *(int *)((long)&(local_150->super_MessageLite)._vptr_MessageLite +
          (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                     *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) *
                        0x33333334 + (this->schema_).oneof_case_offset_)) = local_194;
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar10 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar10 = 0;
  }
  if (bVar10 != 0) {
    internal::LogMessage::LogMessage
              (&local_190,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x97b);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_190,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_120,pLVar1);
    if (bVar10 != 0) {
      internal::LogMessage::~LogMessage(&local_190);
    }
  }
  *(int *)((long)&(local_158->super_MessageLite)._vptr_MessageLite +
          (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                     *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) *
                        0x33333334 + (this->schema_).oneof_case_offset_)) = key;
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}